

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iep2_test.c
# Opt level: O2

void iep2_test(iep2_test_cfg *cfg)

{
  RK_S32 RVar1;
  ulong uVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  byte bVar6;
  IEP2_FIELD_ORDER IVar7;
  int iVar8;
  undefined4 uVar9;
  RK_S32 fd;
  RK_S32 fd_00;
  MPP_RET MVar10;
  iep_com_ctx *piVar11;
  size_t __n;
  size_t __n_00;
  RK_U8 *__ptr;
  RK_U8 *__ptr_00;
  RK_U8 *__s;
  RK_U8 *__s_00;
  size_t sVar12;
  ulong extraout_RAX;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  undefined1 auVar16 [16];
  undefined8 uStackY_1d0;
  MppBufferGroup memGroup;
  uint local_1b8;
  uint local_1b4;
  iep_com_ctx *local_1b0;
  MppBuffer dstbuf [2];
  MppBuffer srcbuf [3];
  RK_S32 fdsrc [3];
  RK_U8 *pdst [2];
  DataCrc checkcrc;
  RK_U8 *psrc [3];
  iep2_api_info dei_info;
  IepImg imgdst [2];
  IepImg imgsrc [3];
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  undefined8 local_3c;
  undefined4 local_34;
  
  piVar11 = (iep_com_ctx *)rockchip_iep2_api_alloc_ctx();
  __n = get_frm_size(cfg->src_fmt,cfg->w,cfg->h);
  __n_00 = get_frm_size(cfg->dst_fmt,cfg->w,cfg->h);
  local_1b0 = piVar11;
  if (piVar11 == (iep_com_ctx *)0x0) {
    _mpp_log_l(2,"iep2_test","Assertion %s failed at %s:%d\n",0,"iep2","iep2_test",0xdc);
    if ((DAT_0010a11b & 0x10) != 0) goto LAB_00102ab5;
  }
  iVar8 = mpp_buffer_group_get(&memGroup,3,0,"iep2_test","iep2_test");
  if (iVar8 != 0) {
    _mpp_log_l(2,"iep2_test","memGroup mpp_buffer_group_get failed\n",0);
    _mpp_log_l(2,"iep2_test","Assertion %s failed at %s:%d\n",0,"0","iep2_test",0xe1);
    if ((DAT_0010a11b & 0x10) != 0) goto LAB_00102ab5;
  }
  checkcrc.len = 0;
  checkcrc.sum_cnt = 0;
  checkcrc.sum = (RK_ULONG *)0x0;
  checkcrc.vor = 0;
  checkcrc._20_4_ = 0;
  checkcrc.sum = (RK_ULONG *)mpp_osal_malloc("iep2_test",0x1000);
  mpp_buffer_get_with_tag(memGroup,srcbuf,__n,"iep2_test","iep2_test");
  mpp_buffer_get_with_tag(memGroup,srcbuf + 1,__n,"iep2_test","iep2_test");
  mpp_buffer_get_with_tag(memGroup,srcbuf + 2,__n,"iep2_test","iep2_test");
  mpp_buffer_get_with_tag(memGroup,dstbuf,__n_00,"iep2_test","iep2_test");
  uVar9 = mpp_buffer_get_with_tag(memGroup,dstbuf + 1,__n_00,"iep2_test","iep2_test");
  auVar16._0_4_ = -(uint)(srcbuf[0]._4_4_ == 0 && (int)srcbuf[0] == 0);
  auVar16._4_4_ = -(uint)((int)srcbuf[1] == 0 && srcbuf[1]._4_4_ == 0);
  auVar16._8_4_ = -(uint)((int)((ulong)srcbuf[2] >> 0x20) == 0 && (int)srcbuf[2] == 0);
  auVar16._12_4_ = -(uint)((int)dstbuf[0] == 0 && (int)((ulong)dstbuf[0] >> 0x20) == 0);
  iVar8 = movmskps(uVar9,auVar16);
  if ((iVar8 != 0) || (dstbuf[1] == (MppBuffer)0x0)) {
    _mpp_log_l(2,"iep2_test","Assertion %s failed at %s:%d\n",0,
               "srcbuf[0] && srcbuf[1] && srcbuf[2] && dstbuf[0] && dstbuf[1]","iep2_test",0xec);
    if ((DAT_0010a11b & 0x10) != 0) {
LAB_00102ab5:
      abort();
    }
  }
  __ptr = (RK_U8 *)mpp_buffer_get_ptr_with_caller
                             (CONCAT44(srcbuf[0]._4_4_,(int)srcbuf[0]),"iep2_test");
  psrc[0] = __ptr;
  __ptr_00 = (RK_U8 *)mpp_buffer_get_ptr_with_caller
                                (CONCAT44(srcbuf[1]._4_4_,(int)srcbuf[1]),"iep2_test");
  psrc[1] = __ptr_00;
  psrc[2] = (RK_U8 *)mpp_buffer_get_ptr_with_caller(srcbuf[2],"iep2_test");
  __s = (RK_U8 *)mpp_buffer_get_ptr_with_caller(dstbuf[0],"iep2_test");
  pdst[0] = __s;
  __s_00 = (RK_U8 *)mpp_buffer_get_ptr_with_caller(dstbuf[1],"iep2_test");
  pdst[1] = __s_00;
  fdsrc[0] = mpp_buffer_get_fd_with_caller(CONCAT44(srcbuf[0]._4_4_,(int)srcbuf[0]),"iep2_test");
  fdsrc[1] = mpp_buffer_get_fd_with_caller(CONCAT44(srcbuf[1]._4_4_,(int)srcbuf[1]),"iep2_test");
  fdsrc[2] = mpp_buffer_get_fd_with_caller(srcbuf[2],"iep2_test");
  fd = mpp_buffer_get_fd_with_caller(dstbuf[0],"iep2_test");
  fd_00 = mpp_buffer_get_fd_with_caller(dstbuf[1],"iep2_test");
  (*local_1b0->ops->init)(&local_1b0->priv);
  sVar12 = fread(__ptr,1,__n,(FILE *)cfg->fp_src);
  if (__n <= sVar12) {
    sVar12 = fread(__ptr_00,1,__n,(FILE *)cfg->fp_src);
    piVar11 = local_1b0;
    if (__n <= sVar12) {
      local_50 = 1;
      uStack_4c = 1;
      uStack_48 = 0;
      uStack_44 = CONCAT44(uStack_44._4_4_,cfg->field_order);
      (*local_1b0->ops->control)(local_1b0->priv,IEP_CMD_SET_DEI_CFG,&local_50);
      local_50 = 0;
      uVar4 = cfg->src_fmt;
      uVar5 = cfg->src_swa;
      uStack_44._0_4_ = cfg->dst_fmt;
      uStack_44._4_4_ = cfg->dst_swa;
      local_3c._0_4_ = cfg->w;
      local_3c._4_4_ = cfg->h;
      uStack_4c = uVar4;
      uStack_48 = uVar5;
      local_34 = (undefined4)local_3c;
      (*piVar11->ops->control)(piVar11->priv,IEP_CMD_SET_DEI_CFG,&local_50);
      RVar1 = cfg->src_fmt;
      for (lVar14 = 0xc; lVar14 != 0x60; lVar14 = lVar14 + 0x1c) {
        *(RK_S32 *)((long)&imgsrc[0].act_w + lVar14) = RVar1;
      }
      imgdst[0].format = cfg->dst_fmt;
      imgdst[1].format = cfg->dst_fmt;
      uVar13 = 1;
      local_1b8 = 0;
      do {
        do {
          uVar2 = uVar13 % 3;
          local_1b4 = (int)uVar2 + 1;
          uVar3 = local_1b4;
          if (local_1b4 == 3) {
            uVar3 = 0;
          }
          sVar12 = fread(psrc[uVar3],1,__n,(FILE *)cfg->fp_src);
          piVar11 = local_1b0;
          if (sVar12 < __n) goto LAB_001026fd;
          uVar13 = (ulong)((int)uVar13 - 1) % 3;
          iep2_test_set_img(local_1b0,cfg->w,cfg->h,imgsrc + uVar2,fdsrc[uVar2],IEP_CMD_SET_SRC);
          iep2_test_set_img(piVar11,cfg->w,cfg->h,imgsrc + uVar3,fdsrc[uVar3],IEP_CMD_SET_DEI_SRC1);
          iep2_test_set_img(piVar11,cfg->w,cfg->h,imgsrc + uVar13,fdsrc[uVar13],IEP_CMD_SET_DEI_SRC2
                           );
          iep2_test_set_img(piVar11,cfg->w,cfg->h,imgdst,fd,IEP_CMD_SET_DST);
          iep2_test_set_img(piVar11,cfg->w,cfg->h,imgdst + 1,fd_00,IEP_CMD_SET_DEI_DST1);
          memset(__s,0,__n_00);
          memset(__s_00,0,__n_00);
          MVar10 = (*piVar11->ops->control)(piVar11->priv,IEP_CMD_RUN_SYNC,&dei_info);
          uVar13 = (ulong)(uint)MVar10;
          if (cfg->fp_slt != (FILE *)0x0) {
            bVar6 = (byte)local_1b8;
            calc_data_crc(pdst[local_1b8 & 1],(RK_U32)__n_00,&checkcrc);
            write_data_crc(cfg->fp_slt,&checkcrc);
            calc_data_crc(pdst[(byte)~bVar6 & 1],(RK_U32)__n_00,&checkcrc);
            write_data_crc(cfg->fp_slt,&checkcrc);
            uVar13 = extraout_RAX;
          }
          IVar7 = dei_info.dil_order;
          local_1b8 = (uint)CONCAT71((int7)(uVar13 >> 8),dei_info.dil_order == IEP2_FIELD_ORDER_BFF)
          ;
          uVar13 = (ulong)local_1b4;
        } while ((FILE *)cfg->fp_dst == (FILE *)0x0);
        sVar12 = fwrite(pdst[dei_info.dil_order == IEP2_FIELD_ORDER_BFF],1,__n_00,
                        (FILE *)cfg->fp_dst);
        if (sVar12 < __n_00) break;
        sVar12 = fwrite(pdst[IVar7 != IEP2_FIELD_ORDER_BFF],1,__n_00,(FILE *)cfg->fp_dst);
        uVar13 = (ulong)local_1b4;
      } while (__n_00 <= sVar12);
      pcVar15 = "destination dump failed\n";
      uStackY_1d0 = 2;
      goto LAB_0010270d;
    }
  }
LAB_001026fd:
  pcVar15 = "source exhaused\n";
  uStackY_1d0 = 4;
LAB_0010270d:
  _mpp_log_l(uStackY_1d0,"iep2_test",pcVar15,0);
  mpp_buffer_put_with_caller(CONCAT44(srcbuf[0]._4_4_,(int)srcbuf[0]),"iep2_test");
  mpp_buffer_put_with_caller(CONCAT44(srcbuf[1]._4_4_,(int)srcbuf[1]),"iep2_test");
  mpp_buffer_put_with_caller(srcbuf[2],"iep2_test");
  mpp_buffer_put_with_caller(dstbuf[0],"iep2_test");
  mpp_buffer_put_with_caller(dstbuf[1],"iep2_test");
  if (checkcrc.sum != (RK_ULONG *)0x0) {
    mpp_osal_free("iep2_test");
  }
  checkcrc.sum = (RK_ULONG *)0x0;
  if (memGroup != (MppBufferGroup)0x0) {
    mpp_buffer_group_put();
    memGroup = (MppBufferGroup)0x0;
  }
  piVar11 = local_1b0;
  (*local_1b0->ops->deinit)(local_1b0->priv);
  rockchip_iep2_api_release_ctx(piVar11);
  return;
}

Assistant:

void iep2_test(iep2_test_cfg *cfg)
{
    iep_com_ctx* iep2 = rockchip_iep2_api_alloc_ctx();
    size_t srcfrmsize = get_frm_size(cfg->src_fmt, cfg->w, cfg->h);
    size_t dstfrmsize = get_frm_size(cfg->dst_fmt, cfg->w, cfg->h);
    MppBuffer srcbuf[3];
    MppBuffer dstbuf[2];
    RK_U8 *psrc[3];
    RK_U8 *pdst[2];
    RK_S32 fdsrc[3];
    RK_S32 fddst[2];
    int prev, curr, next;
    struct iep2_api_params params;
    RK_U32 i;
    RK_S32 field_order = IEP2_FIELD_ORDER_TFF;
    RK_S32 out_order = field_order == IEP2_FIELD_ORDER_TFF ? 0 : 1;
    DataCrc checkcrc;
    struct iep2_api_info dei_info;

    // NOTISE, used IepImg structure for version compatibility consideration,
    // only addresses in this structure are useful in iep2
    IepImg imgsrc[3];
    IepImg imgdst[2];

    mpp_assert(iep2);
    MppBufferGroup memGroup;
    MPP_RET ret = mpp_buffer_group_get_internal(&memGroup, MPP_BUFFER_TYPE_DRM);
    if (MPP_OK != ret) {
        mpp_err("memGroup mpp_buffer_group_get failed\n");
        mpp_assert(0);
    }

    memset(&checkcrc, 0, sizeof(checkcrc));
    checkcrc.sum = mpp_malloc(RK_ULONG, 512);

    mpp_buffer_get(memGroup, &srcbuf[0], srcfrmsize);
    mpp_buffer_get(memGroup, &srcbuf[1], srcfrmsize);
    mpp_buffer_get(memGroup, &srcbuf[2], srcfrmsize);
    mpp_buffer_get(memGroup, &dstbuf[0], dstfrmsize);
    mpp_buffer_get(memGroup, &dstbuf[1], dstfrmsize);
    mpp_assert(srcbuf[0] && srcbuf[1] && srcbuf[2] && dstbuf[0] && dstbuf[1]);

    psrc[0] = mpp_buffer_get_ptr(srcbuf[0]);
    psrc[1] = mpp_buffer_get_ptr(srcbuf[1]);
    psrc[2] = mpp_buffer_get_ptr(srcbuf[2]);

    pdst[0] = mpp_buffer_get_ptr(dstbuf[0]);
    pdst[1] = mpp_buffer_get_ptr(dstbuf[1]);

    fdsrc[0] = mpp_buffer_get_fd(srcbuf[0]);
    fdsrc[1] = mpp_buffer_get_fd(srcbuf[1]);
    fdsrc[2] = mpp_buffer_get_fd(srcbuf[2]);

    fddst[0] = mpp_buffer_get_fd(dstbuf[0]);
    fddst[1] = mpp_buffer_get_fd(dstbuf[1]);

    iep2->ops->init(&iep2->priv);

    if (srcfrmsize > fread(psrc[0], 1, srcfrmsize, cfg->fp_src)) {
        mpp_log("source exhaused\n");
        goto ret;
    }

    if (srcfrmsize > fread(psrc[1], 1, srcfrmsize, cfg->fp_src)) {
        mpp_log("source exhaused\n");
        goto ret;
    }

    curr = 1;

    // set running mode.
    /* if deinterlacing mode is one in the following list:
        IEP2_DIL_MODE_I5O2,
        IEP2_DIL_MODE_I5O1T,
        IEP2_DIL_MODE_I5O1B,
        IEP2_DIL_MODE_DECT
       field order will auto detect by iep2 library.
       so don't try to set field order during the playback.
    */
    params.ptype = IEP2_PARAM_TYPE_MODE;
    params.param.mode.dil_mode = IEP2_DIL_MODE_I5O2;
    params.param.mode.out_mode = IEP2_OUT_MODE_LINE;
    params.param.mode.dil_order = cfg->field_order;

    iep2->ops->control(iep2->priv, IEP_CMD_SET_DEI_CFG, &params);

    // set the image format.
    params.ptype = IEP2_PARAM_TYPE_COM;
    params.param.com.sfmt = cfg->src_fmt;
    params.param.com.dfmt = cfg->dst_fmt;
    params.param.com.sswap = cfg->src_swa;
    params.param.com.dswap = cfg->dst_swa;
    params.param.com.width = cfg->w;
    params.param.com.height = cfg->h;
    params.param.com.hor_stride = cfg->w;
    iep2->ops->control(iep2->priv, IEP_CMD_SET_DEI_CFG, &params);

    for (i = 0; i < MPP_ARRAY_ELEMS(imgsrc); i++)
        imgsrc[i].format = cfg->src_fmt;

    for (i = 0; i < MPP_ARRAY_ELEMS(imgdst); i++)
        imgdst[i].format = cfg->dst_fmt;

    while (1) {
        prev = (curr - 1) % 3;
        curr = curr % 3;
        next = (curr + 1) % 3;

        if (srcfrmsize > fread(psrc[next], 1, srcfrmsize, cfg->fp_src)) {
            mpp_log("source exhaused\n");
            break;
        }

        // notice the order of the input frames.
        iep2_test_set_img(iep2, cfg->w, cfg->h,
                          &imgsrc[curr], fdsrc[curr], IEP_CMD_SET_SRC);
        iep2_test_set_img(iep2, cfg->w, cfg->h,
                          &imgsrc[next], fdsrc[next], IEP_CMD_SET_DEI_SRC1);
        iep2_test_set_img(iep2, cfg->w, cfg->h,
                          &imgsrc[prev], fdsrc[prev], IEP_CMD_SET_DEI_SRC2);
        iep2_test_set_img(iep2, cfg->w, cfg->h,
                          &imgdst[0], fddst[0], IEP_CMD_SET_DST);
        iep2_test_set_img(iep2, cfg->w, cfg->h,
                          &imgdst[1], fddst[1], IEP_CMD_SET_DEI_DST1);

        memset(pdst[0], 0, dstfrmsize);
        memset(pdst[1], 0, dstfrmsize);
        iep2->ops->control(iep2->priv, IEP_CMD_RUN_SYNC, &dei_info);

        if (cfg->fp_slt) {
            calc_data_crc(pdst[out_order], dstfrmsize, &checkcrc);
            write_data_crc(cfg->fp_slt, &checkcrc);
            calc_data_crc(pdst[1 - out_order], dstfrmsize, &checkcrc);
            write_data_crc(cfg->fp_slt, &checkcrc);
        }

        out_order = dei_info.dil_order == IEP2_FIELD_ORDER_BFF ? 1 : 0;

        if (cfg->fp_dst) {
            if (dstfrmsize > fwrite(pdst[out_order], 1, dstfrmsize, cfg->fp_dst)) {
                mpp_err("destination dump failed\n");
                break;
            }

            if (dstfrmsize > fwrite(pdst[1 - out_order], 1, dstfrmsize, cfg->fp_dst)) {
                mpp_err("destination dump failed\n");
                break;
            }
        }

        curr++;
    }

ret:
    mpp_buffer_put(srcbuf[0]);
    mpp_buffer_put(srcbuf[1]);
    mpp_buffer_put(srcbuf[2]);

    mpp_buffer_put(dstbuf[0]);
    mpp_buffer_put(dstbuf[1]);

    MPP_FREE(checkcrc.sum);

    if (memGroup) {
        mpp_buffer_group_put(memGroup);
        memGroup = NULL;
    }

    iep2->ops->deinit(iep2->priv);

    rockchip_iep2_api_release_ctx(iep2);
}